

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O2

string * build_path(string *__return_storage_ptr__,string *crt_dirpath,string *domain_name,
                   string *crt_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,crt_dirpath,"/");
  std::operator+(&local_80,&local_40,domain_name);
  std::operator+(&local_60,&local_80,"/");
  std::operator+(__return_storage_ptr__,&local_60,crt_filename);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string build_path(const std::string& crt_dirpath,
                         const std::string& domain_name, 
                           const std::string& crt_filename) {
    return crt_dirpath + "/" + domain_name + "/" + crt_filename;
}